

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O1

void wiz_play_item_standard_upkeep(player *p,object *obj)

{
  player_upkeep *ppVar1;
  _Bool _Var2;
  uint uVar3;
  
  _Var2 = object_is_carried(p,obj);
  ppVar1 = p->upkeep;
  uVar3 = 0x800000;
  if (_Var2) {
    ppVar1->update = ppVar1->update | 0x201;
    *(byte *)&ppVar1->notice = (byte)ppVar1->notice | 1;
    uVar3 = 0x60000;
  }
  ppVar1->redraw = ppVar1->redraw | uVar3;
  return;
}

Assistant:

static void wiz_play_item_standard_upkeep(struct player *p, struct object *obj)
{
	if (object_is_carried(p, obj)) {
		p->upkeep->update |= (PU_BONUS | PU_INVEN);
		p->upkeep->notice |= (PN_COMBINE);
		p->upkeep->redraw |= (PR_INVEN | PR_EQUIP);
	} else {
		p->upkeep->redraw |= (PR_ITEMLIST);
	}
}